

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::decoder_etc_block::get_block_colors5_bounds
               (color32 *pBlock_colors,color32 *base_color5,uint32_t inten_table,uint32_t l,
               uint32_t h)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  bVar1 = (base_color5->field_0).field_0.r;
  bVar2 = (base_color5->field_0).field_0.g;
  bVar3 = (base_color5->field_0).field_0.b;
  uVar5 = (uint)(byte)(bVar1 >> 2 | bVar1 * '\b');
  iVar4 = (&g_etc1_inten_tables)[(ulong)inten_table * 4 + (ulong)l];
  uVar6 = iVar4 + uVar5;
  if (0xff < uVar6) {
    if ((int)uVar6 < 0) {
      uVar6 = 0;
    }
    else if (0xfe < (int)uVar6) {
      uVar6 = 0xff;
    }
  }
  uVar7 = (uint)(byte)(bVar2 >> 2 | bVar2 * '\b');
  uVar11 = iVar4 + uVar7;
  if (0xff < uVar11) {
    if ((int)uVar11 < 0) {
      uVar11 = 0;
    }
    else if (0xfe < (int)uVar11) {
      uVar11 = 0xff;
    }
  }
  uVar8 = (uint)(byte)(bVar3 * '\b' | bVar3 >> 2);
  uVar9 = iVar4 + uVar8;
  uVar10 = uVar9;
  if (0xff < uVar9) {
    if ((int)uVar9 < 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0xff;
      if ((int)uVar9 < 0xff) {
        uVar10 = uVar9;
      }
    }
  }
  (pBlock_colors->field_0).field_0.r = (uint8_t)uVar6;
  (pBlock_colors->field_0).field_0.g = (uint8_t)uVar11;
  (pBlock_colors->field_0).field_0.b = (uint8_t)uVar10;
  (pBlock_colors->field_0).field_0.a = 0xff;
  iVar4 = (&g_etc1_inten_tables)[(ulong)inten_table * 4 + (ulong)h];
  uVar5 = uVar5 + iVar4;
  uVar6 = uVar5;
  if (0xff < uVar5) {
    if ((int)uVar5 < 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0xff;
      if ((int)uVar5 < 0xff) {
        uVar6 = uVar5;
      }
    }
  }
  uVar7 = uVar7 + iVar4;
  uVar5 = uVar7;
  if (0xff < uVar7) {
    if ((int)uVar7 < 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0xff;
      if ((int)uVar7 < 0xff) {
        uVar5 = uVar7;
      }
    }
  }
  uVar8 = iVar4 + uVar8;
  if (0xff < uVar8) {
    if ((int)uVar8 < 0) {
      uVar8 = 0;
    }
    else if (0xfe < (int)uVar8) {
      uVar8 = 0xff;
    }
  }
  pBlock_colors[1].field_0.field_0.r = (uint8_t)uVar6;
  pBlock_colors[1].field_0.field_0.g = (uint8_t)uVar5;
  pBlock_colors[1].field_0.field_0.b = (uint8_t)uVar8;
  pBlock_colors[1].field_0.field_0.a = 0xff;
  return;
}

Assistant:

static void get_block_colors5_bounds(color32* pBlock_colors, const color32& base_color5, uint32_t inten_table, uint32_t l = 0, uint32_t h = 3)
		{
			color32 b(base_color5);

			b.r = (b.r << 3) | (b.r >> 2);
			b.g = (b.g << 3) | (b.g >> 2);
			b.b = (b.b << 3) | (b.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[l]), clamp255(b.g + pInten_table[l]), clamp255(b.b + pInten_table[l]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[h]), clamp255(b.g + pInten_table[h]), clamp255(b.b + pInten_table[h]), 255);
		}